

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int withExpand(Walker *pWalker,SrcList_item *pFrom)

{
  undefined1 uVar1;
  undefined1 uVar3;
  int *piVar2;
  undefined6 uVar4;
  Select *p;
  int iVar5;
  undefined8 *puVar6;
  char *pcVar7;
  Select *pSVar8;
  long lVar9;
  bool bVar10;
  Select *pPrior;
  SrcList_item *pItem;
  SrcList *pSrc;
  int i;
  With *pSavedWith;
  Select *pSStack_60;
  int bMayRecursive;
  Select *pLeft;
  Select *pSel;
  ExprList *pEList;
  Table *pTab;
  With *pWith;
  Cte *pCte;
  sqlite3 *db;
  Parse *pParse;
  SrcList_item *pFrom_local;
  Walker *pWalker_local;
  
  db = (sqlite3 *)pWalker->pParse;
  pCte = (Cte *)db->pVfs;
  pParse = (Parse *)pFrom;
  pFrom_local = (SrcList_item *)pWalker;
  pWith = (With *)searchWith(*(With **)&db->aDbStatic[0].safety_level,pFrom,(With **)&pTab);
  if (pWith != (With *)0x0) {
    if (pWith->a[0].pCols != (ExprList *)0x0) {
      sqlite3ErrorMsg((Parse *)db,(char *)pWith->a[0].pCols,*(undefined8 *)pWith);
      return 1;
    }
    iVar5 = cannotBeFunction((Parse *)db,(SrcList_item *)pParse);
    if (iVar5 != 0) {
      return 1;
    }
    puVar6 = (undefined8 *)sqlite3DbMallocZero((sqlite3 *)pCte,0x80);
    *(undefined8 **)&pParse->isMultiWrite = puVar6;
    if (puVar6 == (undefined8 *)0x0) {
      return 2;
    }
    *(undefined4 *)((long)puVar6 + 0x3c) = 1;
    pcVar7 = sqlite3DbStrDup((sqlite3 *)pCte,*(char **)pWith);
    *puVar6 = pcVar7;
    *(undefined2 *)(puVar6 + 8) = 0xffff;
    *(undefined2 *)((long)puVar6 + 0x44) = 200;
    *(byte *)(puVar6 + 9) = *(byte *)(puVar6 + 9) | 0x42;
    pSVar8 = sqlite3SelectDup((sqlite3 *)pCte,(Select *)pWith->a[0].zName,0);
    *(Select **)&pParse->nRangeReg = pSVar8;
    if (*(char *)((long)&pCte[2].pSelect + 5) != '\0') {
      return 7;
    }
    pSVar8 = *(Select **)&pParse->nRangeReg;
    bVar10 = true;
    if (pSVar8->op != 't') {
      bVar10 = pSVar8->op == 's';
    }
    if (bVar10) {
      piVar2 = *(int **)(*(long *)&pParse->nRangeReg + 0x20);
      for (pSrc._4_4_ = 0; pSrc._4_4_ < *piVar2; pSrc._4_4_ = pSrc._4_4_ + 1) {
        lVar9 = (long)pSrc._4_4_;
        if (((*(long *)(piVar2 + lVar9 * 0x1c + 4) == 0) &&
            (*(long *)(piVar2 + lVar9 * 0x1c + 6) != 0)) &&
           (iVar5 = sqlite3StrICmp(*(char **)(piVar2 + lVar9 * 0x1c + 6),*(char **)pWith),
           iVar5 == 0)) {
          *(undefined8 **)(piVar2 + lVar9 * 0x1c + 10) = puVar6;
          *(byte *)((long)piVar2 + lVar9 * 0x70 + 0x45) =
               *(byte *)((long)piVar2 + lVar9 * 0x70 + 0x45) & 0xdf | 0x20;
          *(int *)((long)puVar6 + 0x3c) = *(int *)((long)puVar6 + 0x3c) + 1;
          pSVar8->selFlags = pSVar8->selFlags | 0x2000;
        }
      }
    }
    if (2 < *(uint *)((long)puVar6 + 0x3c)) {
      sqlite3ErrorMsg((Parse *)db,"multiple references to recursive table: %s",*(undefined8 *)pWith)
      ;
      return 1;
    }
    pWith->a[0].pCols = (ExprList *)"circular reference: %s";
    uVar1 = db->aDbStatic[0].safety_level;
    uVar3 = db->aDbStatic[0].bSyncSet;
    uVar4 = *(undefined6 *)&db->aDbStatic[0].field_0x12;
    *(Table **)&db->aDbStatic[0].safety_level = pTab;
    if (bVar10) {
      p = pSVar8->pPrior;
      p->pWith = pSVar8->pWith;
      sqlite3WalkSelect((Walker *)pFrom_local,p);
      p->pWith = (With *)0x0;
    }
    else {
      sqlite3WalkSelect((Walker *)pFrom_local,pSVar8);
    }
    *(Table **)&db->aDbStatic[0].safety_level = pTab;
    for (pSStack_60 = pSVar8; pSStack_60->pPrior != (Select *)0x0; pSStack_60 = pSStack_60->pPrior)
    {
    }
    pSel = (Select *)pSStack_60->pEList;
    if (pWith->pOuter != (With *)0x0) {
      if ((pSel != (Select *)0x0) && (*(int *)&pSel->pEList != pWith->pOuter->nCte)) {
        sqlite3ErrorMsg((Parse *)db,"table %s has %d values for %d columns",*(undefined8 *)pWith,
                        (ulong)*(uint *)&pSel->pEList,(ulong)(uint)pWith->pOuter->nCte);
        db->aDbStatic[0].safety_level = uVar1;
        db->aDbStatic[0].bSyncSet = uVar3;
        *(undefined6 *)&db->aDbStatic[0].field_0x12 = uVar4;
        return 1;
      }
      pSel = (Select *)pWith->pOuter;
    }
    sqlite3ColumnsFromExprList
              ((Parse *)db,(ExprList *)pSel,(i16 *)((long)puVar6 + 0x42),(Column **)(puVar6 + 1));
    if (bVar10) {
      if ((pSVar8->selFlags & 0x2000) == 0) {
        pWith->a[0].pCols = (ExprList *)"recursive reference in a subquery: %s";
      }
      else {
        pWith->a[0].pCols = (ExprList *)"multiple recursive references: %s";
      }
      sqlite3WalkSelect((Walker *)pFrom_local,pSVar8);
    }
    pWith->a[0].pCols = (ExprList *)0x0;
    db->aDbStatic[0].safety_level = uVar1;
    db->aDbStatic[0].bSyncSet = uVar3;
    *(undefined6 *)&db->aDbStatic[0].field_0x12 = uVar4;
  }
  return 0;
}

Assistant:

static int withExpand(
  Walker *pWalker, 
  struct SrcList_item *pFrom
){
  Parse *pParse = pWalker->pParse;
  sqlite3 *db = pParse->db;
  struct Cte *pCte;               /* Matched CTE (or NULL if no match) */
  With *pWith;                    /* WITH clause that pCte belongs to */

  assert( pFrom->pTab==0 );

  pCte = searchWith(pParse->pWith, pFrom, &pWith);
  if( pCte ){
    Table *pTab;
    ExprList *pEList;
    Select *pSel;
    Select *pLeft;                /* Left-most SELECT statement */
    int bMayRecursive;            /* True if compound joined by UNION [ALL] */
    With *pSavedWith;             /* Initial value of pParse->pWith */

    /* If pCte->zCteErr is non-NULL at this point, then this is an illegal
    ** recursive reference to CTE pCte. Leave an error in pParse and return
    ** early. If pCte->zCteErr is NULL, then this is not a recursive reference.
    ** In this case, proceed.  */
    if( pCte->zCteErr ){
      sqlite3ErrorMsg(pParse, pCte->zCteErr, pCte->zName);
      return SQLITE_ERROR;
    }
    if( cannotBeFunction(pParse, pFrom) ) return SQLITE_ERROR;

    assert( pFrom->pTab==0 );
    pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
    if( pTab==0 ) return WRC_Abort;
    pTab->nTabRef = 1;
    pTab->zName = sqlite3DbStrDup(db, pCte->zName);
    pTab->iPKey = -1;
    pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
    pTab->tabFlags |= TF_Ephemeral | TF_NoVisibleRowid;
    pFrom->pSelect = sqlite3SelectDup(db, pCte->pSelect, 0);
    if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
    assert( pFrom->pSelect );

    /* Check if this is a recursive CTE. */
    pSel = pFrom->pSelect;
    bMayRecursive = ( pSel->op==TK_ALL || pSel->op==TK_UNION );
    if( bMayRecursive ){
      int i;
      SrcList *pSrc = pFrom->pSelect->pSrc;
      for(i=0; i<pSrc->nSrc; i++){
        struct SrcList_item *pItem = &pSrc->a[i];
        if( pItem->zDatabase==0 
         && pItem->zName!=0 
         && 0==sqlite3StrICmp(pItem->zName, pCte->zName)
          ){
          pItem->pTab = pTab;
          pItem->fg.isRecursive = 1;
          pTab->nTabRef++;
          pSel->selFlags |= SF_Recursive;
        }
      }
    }

    /* Only one recursive reference is permitted. */ 
    if( pTab->nTabRef>2 ){
      sqlite3ErrorMsg(
          pParse, "multiple references to recursive table: %s", pCte->zName
      );
      return SQLITE_ERROR;
    }
    assert( pTab->nTabRef==1 || ((pSel->selFlags&SF_Recursive) && pTab->nTabRef==2 ));

    pCte->zCteErr = "circular reference: %s";
    pSavedWith = pParse->pWith;
    pParse->pWith = pWith;
    if( bMayRecursive ){
      Select *pPrior = pSel->pPrior;
      assert( pPrior->pWith==0 );
      pPrior->pWith = pSel->pWith;
      sqlite3WalkSelect(pWalker, pPrior);
      pPrior->pWith = 0;
    }else{
      sqlite3WalkSelect(pWalker, pSel);
    }
    pParse->pWith = pWith;

    for(pLeft=pSel; pLeft->pPrior; pLeft=pLeft->pPrior);
    pEList = pLeft->pEList;
    if( pCte->pCols ){
      if( pEList && pEList->nExpr!=pCte->pCols->nExpr ){
        sqlite3ErrorMsg(pParse, "table %s has %d values for %d columns",
            pCte->zName, pEList->nExpr, pCte->pCols->nExpr
        );
        pParse->pWith = pSavedWith;
        return SQLITE_ERROR;
      }
      pEList = pCte->pCols;
    }

    sqlite3ColumnsFromExprList(pParse, pEList, &pTab->nCol, &pTab->aCol);
    if( bMayRecursive ){
      if( pSel->selFlags & SF_Recursive ){
        pCte->zCteErr = "multiple recursive references: %s";
      }else{
        pCte->zCteErr = "recursive reference in a subquery: %s";
      }
      sqlite3WalkSelect(pWalker, pSel);
    }
    pCte->zCteErr = 0;
    pParse->pWith = pSavedWith;
  }

  return SQLITE_OK;
}